

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

void Ivy_FraigSimulateOne(Ivy_FraigMan_t *p)

{
  Vec_Ptr_t *p_00;
  abctime aVar1;
  Ivy_Obj_t *pObj;
  abctime aVar2;
  int i;
  
  aVar1 = Abc_Clock();
  for (i = 0; p_00 = p->pManAig->vObjs, i < p_00->nSize; i = i + 1) {
    pObj = (Ivy_Obj_t *)Vec_PtrEntry(p_00,i);
    if ((pObj != (Ivy_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x8 & 0xf) - 7)) {
      Ivy_NodeSimulate(p,pObj);
    }
  }
  aVar2 = Abc_Clock();
  p->timeSim = p->timeSim + (aVar2 - aVar1);
  p->nSimRounds = p->nSimRounds + 1;
  return;
}

Assistant:

void Ivy_FraigSimulateOne( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    abctime clk;
clk = Abc_Clock();
    Ivy_ManForEachNode( p->pManAig, pObj, i )
    {
        Ivy_NodeSimulate( p, pObj );
/*
        if ( Ivy_ObjFraig(pObj) == NULL )
            printf( "%3d --- -- %d  :  ", pObj->Id, pObj->fPhase );
        else
            printf( "%3d %3d %2d %d  :  ", pObj->Id, Ivy_Regular(Ivy_ObjFraig(pObj))->Id, Ivy_ObjSatNum(Ivy_Regular(Ivy_ObjFraig(pObj))), pObj->fPhase );
        Extra_PrintBinary( stdout, Ivy_ObjSim(pObj), 30 );
        printf( "\n" );
*/
    }
p->timeSim += Abc_Clock() - clk;
p->nSimRounds++;
}